

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O0

int __thiscall DIS::AggregateStatePdu::getMarshalledSize(AggregateStatePdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_type sVar11;
  const_reference pvVar12;
  const_reference pvVar13;
  const_reference pvVar14;
  const_reference pvVar15;
  undefined1 local_c0 [8];
  VariableDatum listElement_4;
  unsigned_long_long idx_4;
  EntityType listElement_3;
  unsigned_long_long idx_3;
  EntityType listElement_2;
  unsigned_long_long idx_2;
  EntityID listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  AggregateID listElement;
  unsigned_long_long idx;
  int marshalSize;
  AggregateStatePdu *this_local;
  
  iVar2 = EntityManagementFamilyPdu::getMarshalledSize(&this->super_EntityManagementFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_aggregateID);
  iVar4 = EntityType::getMarshalledSize(&this->_aggregateType);
  iVar5 = AggregateMarking::getMarshalledSize(&this->_aggregateMarking);
  iVar6 = Vector3Float::getMarshalledSize(&this->_dimensions);
  iVar7 = Orientation::getMarshalledSize(&this->_orientation);
  iVar8 = Vector3Double::getMarshalledSize(&this->_centerOfMass);
  iVar9 = Vector3Float::getMarshalledSize(&this->_velocity);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 + 0xe;
  listElement._site = 0;
  listElement._application = 0;
  listElement._aggregateID = 0;
  listElement._14_2_ = 0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar11 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::size
                       (&this->_aggregateIDList);
    if (sVar11 <= (ulong)uVar1) break;
    pvVar12 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::operator[]
                        (&this->_aggregateIDList,listElement._8_8_);
    AggregateID::AggregateID((AggregateID *)local_30,pvVar12);
    iVar2 = AggregateID::getMarshalledSize((AggregateID *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    AggregateID::~AggregateID((AggregateID *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._site = 0;
  listElement_1._application = 0;
  listElement_1._entity = 0;
  listElement_1._14_2_ = 0;
  while( true ) {
    uVar1 = listElement_1._8_8_;
    sVar11 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::size(&this->_entityIDList);
    if (sVar11 <= (ulong)uVar1) break;
    pvVar13 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::operator[]
                        (&this->_entityIDList,listElement_1._8_8_);
    EntityID::EntityID((EntityID *)&idx_2,pvVar13);
    iVar2 = EntityID::getMarshalledSize((EntityID *)&idx_2);
    idx._4_4_ = idx._4_4_ + iVar2;
    EntityID::~EntityID((EntityID *)&idx_2);
    listElement_1._8_8_ = listElement_1._8_8_ + 1;
  }
  idx._4_4_ = idx._4_4_ + 1;
  listElement_2._entityKind = '\0';
  listElement_2._domain = '\0';
  listElement_2._country = 0;
  listElement_2._category = '\0';
  listElement_2._subcategory = '\0';
  listElement_2._specific = '\0';
  listElement_2._extra = '\0';
  while( true ) {
    uVar1 = listElement_2._8_8_;
    sVar11 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                       (&this->_silentAggregateSystemList);
    if (sVar11 <= (ulong)uVar1) break;
    pvVar14 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                        (&this->_silentAggregateSystemList,listElement_2._8_8_);
    EntityType::EntityType((EntityType *)&idx_3,pvVar14);
    iVar2 = EntityType::getMarshalledSize((EntityType *)&idx_3);
    idx._4_4_ = idx._4_4_ + iVar2;
    EntityType::~EntityType((EntityType *)&idx_3);
    listElement_2._8_8_ = listElement_2._8_8_ + 1;
  }
  listElement_3._entityKind = '\0';
  listElement_3._domain = '\0';
  listElement_3._country = 0;
  listElement_3._category = '\0';
  listElement_3._subcategory = '\0';
  listElement_3._specific = '\0';
  listElement_3._extra = '\0';
  while( true ) {
    uVar1 = listElement_3._8_8_;
    sVar11 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                       (&this->_silentEntitySystemList);
    if (sVar11 <= (ulong)uVar1) break;
    pvVar14 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                        (&this->_silentEntitySystemList,listElement_3._8_8_);
    EntityType::EntityType((EntityType *)&idx_4,pvVar14);
    iVar2 = EntityType::getMarshalledSize((EntityType *)&idx_4);
    idx._4_4_ = idx._4_4_ + iVar2;
    EntityType::~EntityType((EntityType *)&idx_4);
    listElement_3._8_8_ = listElement_3._8_8_ + 1;
  }
  idx._4_4_ = idx._4_4_ + 4;
  listElement_4._arrayLength = 0;
  listElement_4._44_4_ = 0;
  while( true ) {
    uVar1 = listElement_4._40_8_;
    sVar11 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                       (&this->_variableDatumList);
    if (sVar11 <= (ulong)uVar1) break;
    pvVar15 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                        (&this->_variableDatumList,listElement_4._40_8_);
    VariableDatum::VariableDatum((VariableDatum *)local_c0,pvVar15);
    uVar10 = VariableDatum::getMarshalledSize((VariableDatum *)local_c0);
    idx._4_4_ = idx._4_4_ + uVar10;
    VariableDatum::~VariableDatum((VariableDatum *)local_c0);
    listElement_4._40_8_ = listElement_4._40_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int AggregateStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _aggregateID.getMarshalledSize();  // _aggregateID
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _aggregateState
   marshalSize = marshalSize + _aggregateType.getMarshalledSize();  // _aggregateType
   marshalSize = marshalSize + 4;  // _formation
   marshalSize = marshalSize + _aggregateMarking.getMarshalledSize();  // _aggregateMarking
   marshalSize = marshalSize + _dimensions.getMarshalledSize();  // _dimensions
   marshalSize = marshalSize + _orientation.getMarshalledSize();  // _orientation
   marshalSize = marshalSize + _centerOfMass.getMarshalledSize();  // _centerOfMass
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + 2;  // _numberOfDisAggregates
   marshalSize = marshalSize + 2;  // _numberOfDisEntities
   marshalSize = marshalSize + 2;  // _numberOfSilentAggregateTypes
   marshalSize = marshalSize + 2;  // _numberOfSilentEntityTypes

   for(unsigned long long idx=0; idx < _aggregateIDList.size(); idx++)
   {
        AggregateID listElement = _aggregateIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _entityIDList.size(); idx++)
   {
        EntityID listElement = _entityIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

   marshalSize = marshalSize + 1;  // _pad2

   for(unsigned long long idx=0; idx < _silentAggregateSystemList.size(); idx++)
   {
        EntityType listElement = _silentAggregateSystemList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _silentEntitySystemList.size(); idx++)
   {
        EntityType listElement = _silentEntitySystemList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _variableDatumList.size(); idx++)
   {
        VariableDatum listElement = _variableDatumList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}